

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

vec3f * barycentric(vec3f *__return_storage_ptr__,vec2i *pts,vec2i P)

{
  int iVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  iVar1 = pts->x;
  iVar2 = pts->y;
  dVar6 = (double)(pts[2].x - iVar1);
  dVar3 = (double)(pts[1].x - iVar1);
  dVar4 = (double)(pts[2].y - iVar2);
  dVar7 = (double)(pts[1].y - iVar2);
  dVar5 = dVar6 * dVar7 - dVar3 * dVar4;
  dVar8 = 1.0;
  if (1.0 <= ABS(dVar5)) {
    dVar9 = (double)(iVar1 - P.x);
    dVar10 = (double)(iVar2 - P.y);
    dVar8 = dVar4 * dVar9 - dVar6 * dVar10;
    dVar3 = dVar3 * dVar10 - dVar7 * dVar9;
    dVar4 = 1.0 - (dVar8 + dVar3) / dVar5;
    dVar8 = dVar8 / dVar5;
    dVar3 = dVar3 / dVar5;
  }
  else {
    dVar4 = -1.0;
    dVar3 = 1.0;
  }
  __return_storage_ptr__->x = dVar4;
  __return_storage_ptr__->y = dVar8;
  __return_storage_ptr__->z = dVar3;
  return __return_storage_ptr__;
}

Assistant:

vec3f barycentric(vec2i *pts, vec2i P)
{
    vec3f u = cross(vec3f(pts[2][0] - pts[0][0], pts[1][0] - pts[0][0], pts[0][0] - P[0]),
                    vec3f(pts[2][1] - pts[0][1], pts[1][1] - pts[0][1], pts[0][1] - P[1]));
    /* `pts` and `P` has integer value as coordinates
       so `abs(u[2])` < 1 means `u[2]` is 0, that means triangle is degenerate
       in this case return something with negative coordinates */
    if (std::abs(u[2]) < 1) return vec3f(-1, 1, 1);
    return vec3f(1.f - (u.x + u.y) / u.z, u.y / u.z, u.x / u.z);
}